

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.h
# Opt level: O0

void __thiscall
presolve::dev_kkt_check::KktConditionDetails::KktConditionDetails(KktConditionDetails *this)

{
  KktConditionDetails *this_local;
  
  this->type = kUnset;
  this->max_violation = 0.0;
  this->sum_violation_2 = 0.0;
  this->checked = 0;
  this->violated = 0;
  return;
}

Assistant:

KktConditionDetails() {}